

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool __thiscall wallet::WalletInit::ParameterInteraction(WalletInit *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  reference pbVar4;
  long in_FS_OFFSET;
  char (*unaff_retaddr) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  string *wallet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  iterator __end2;
  iterator __begin2;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe58;
  undefined1 fDefault;
  reference in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  bool local_17a;
  allocator<char> *in_stack_fffffffffffffe88;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffffea0;
  LogFlags in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  byte bVar5;
  undefined1 in_stack_fffffffffffffebf;
  byte bVar6;
  ArgsManager *in_stack_fffffffffffffec0;
  ConstevalFormatString<1U> in_stack_fffffffffffffef8;
  string_view in_stack_ffffffffffffff00;
  string_view in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a9;
  allocator<char> local_89 [121];
  Level in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  bVar2 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffffe50,
                     (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::allocator<char>::~allocator(local_89);
  if ((bVar2 & 1) == 0) {
    __a = (allocator<char> *)&stack0xffffffffffffff1f;
    std::allocator<char>::allocator();
    fDefault = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
    bVar6 = 0;
    bVar5 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,__a);
    bVar3 = ArgsManager::GetBoolArg
                      ((ArgsManager *)in_stack_fffffffffffffe50,
                       (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (bool)fDefault);
    local_17a = false;
    if (bVar3) {
      std::allocator<char>::allocator();
      bVar6 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,__a);
      bVar5 = 1;
      local_17a = ArgsManager::SoftSetBoolArg
                            ((ArgsManager *)CONCAT17(bVar2,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe98,
                             SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    }
    if ((bVar5 & 1) != 0) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    if ((bVar6 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1e);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
    if (local_17a != false) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      LogPrintFormatInternal<char[21]>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff00,
                 CONCAT13(bVar6,CONCAT12(bVar5,in_stack_fffffffffffffebc)),0x1d3c16e,
                 in_stack_fffffffffffffff0,in_stack_fffffffffffffef8,unaff_retaddr);
    }
  }
  else {
    this_00 = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    ArgsManager::GetArgs
              (in_stack_fffffffffffffec0,
               (string *)
               CONCAT17(in_stack_fffffffffffffebf,
                        CONCAT16(in_stack_fffffffffffffebe,
                                 CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffe50);
    while (bVar3 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe58,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe50), ((bVar3 ^ 0xffU) & 1) != 0) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      in_stack_fffffffffffffe58 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1cf76f7;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe50 =
           "%s: parameter interaction: -disablewallet -> ignoring -wallet=%s\n";
      in_stack_fffffffffffffe48 = 2;
      LogPrintFormatInternal<char[21],std::__cxx11::string>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff00,
                 CONCAT13(in_stack_fffffffffffffebf,
                          CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffff0,
                 (ConstevalFormatString<2U>)in_stack_fffffffffffffef8.fmt,unaff_retaddr,
                 in_stack_00000008);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      in_stack_fffffffffffffe60 = pbVar4;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffe58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool WalletInit::ParameterInteraction() const
{
#ifdef USE_BDB
     if (!BerkeleyDatabaseSanityCheck()) {
         return InitError(Untranslated("A version conflict was detected between the run-time BerkeleyDB library and the one used during compilation."));
     }
#endif
    if (gArgs.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        for (const std::string& wallet : gArgs.GetArgs("-wallet")) {
            LogPrintf("%s: parameter interaction: -disablewallet -> ignoring -wallet=%s\n", __func__, wallet);
        }

        return true;
    }

    if (gArgs.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY) && gArgs.SoftSetBoolArg("-walletbroadcast", false)) {
        LogPrintf("%s: parameter interaction: -blocksonly=1 -> setting -walletbroadcast=0\n", __func__);
    }

    return true;
}